

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

void __thiscall
S2BooleanOperation::Impl::CrossingProcessor::DoneBoundaryPair(CrossingProcessor *this)

{
  SourceIdMap *this_00;
  pointer *pppVar1;
  InputEdgeCrossings *pIVar2;
  pair<int,_(anonymous_namespace)::CrossingInputEdge> *ppVar3;
  pair<int,_(anonymous_namespace)::CrossingInputEdge> *ppVar4;
  pointer ppVar5;
  CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
  node;
  mapped_type *pmVar6;
  pointer ppVar7;
  ulong uVar8;
  pointer ppVar9;
  ulong uVar10;
  pair<int,_(anonymous_namespace)::CrossingInputEdge> *ppVar11;
  S2LogMessage *key;
  pair<int,_(anonymous_namespace)::CrossingInputEdge> pVar12;
  long lVar13;
  pointer ppVar14;
  _Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
  *p_Var15;
  iterator iVar16;
  iterator iVar17;
  S2LogMessage local_40;
  
  this_00 = &this->source_id_map_;
  local_40.severity_ = kInfo;
  local_40._4_4_ = 0xffffffff;
  pmVar6 = gtl::internal_btree::
           btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
           ::operator[](&this_00->
                         super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                        ,(key_type *)&local_40);
  *pmVar6 = -1;
  local_40.severity_ = kInfo;
  local_40._4_4_ = 0xfffffffe;
  pmVar6 = gtl::internal_btree::
           btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
           ::operator[](&this_00->
                         super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                        ,(key_type *)&local_40);
  *pmVar6 = -2;
  local_40.severity_ = kInfo;
  local_40._4_4_ = 0xfffffffd;
  key = &local_40;
  pmVar6 = gtl::internal_btree::
           btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
           ::operator[](&this_00->
                         super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
                        ,(key_type *)key);
  *pmVar6 = -3;
  pIVar2 = this->input_crossings_;
  ppVar9 = (pIVar2->
           super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(pIVar2->
                 super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar9;
  p_Var15 = (_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
             *)(((long)(this->source_edge_crossings_).
                       super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->source_edge_crossings_).
                       super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) + (lVar13 >> 3));
  if ((ulong)p_Var15 >> 0x3c != 0) {
    std::__throw_length_error("vector::reserve");
  }
  if ((_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
       *)((long)(pIVar2->
                super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar9 >> 3) < p_Var15)
  {
    ppVar7 = std::
             _Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
             ::_M_allocate(p_Var15,(size_t)key);
    ppVar4 = (pIVar2->
             super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    ppVar3 = (pIVar2->
             super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar9 = ppVar7;
    for (ppVar11 = ppVar3; ppVar11 != ppVar4; ppVar11 = ppVar11 + 1) {
      *ppVar9 = *ppVar11;
      ppVar9 = ppVar9 + 1;
    }
    if (ppVar3 != (pair<int,_(anonymous_namespace)::CrossingInputEdge> *)0x0) {
      operator_delete(ppVar3);
    }
    (pIVar2->
    super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
    )._M_impl.super__Vector_impl_data._M_start = ppVar7;
    (pIVar2->
    super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)(lVar13 + (long)ppVar7);
    (pIVar2->
    super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar7 + (long)p_Var15;
  }
  ppVar14 = (this->source_edge_crossings_).
            super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar5 = (this->source_edge_crossings_).
           super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar14 == ppVar5) {
      ppVar14 = (this->source_edge_crossings_).
                super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((this->source_edge_crossings_).
          super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != ppVar14) {
        (this->source_edge_crossings_).
        super__Vector_base<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>,_std::allocator<std::pair<int,_std::pair<S2BooleanOperation::SourceId,_bool>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar14;
      }
      node.
      super_Storage<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_2UL,_false>
      .value = (this_00->
               super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
               ).
               super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
               .
               super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
               .tree_.root_.
               super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
               .
               super_Storage<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_2UL,_false>
      ;
      if (node.
          super_Storage<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_2UL,_false>
          .value != (T)0x0) {
        gtl::internal_btree::
        btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
        ::internal_clear((btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                          *)this_00,
                         (node_type *)
                         node.
                         super_Storage<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_2UL,_false>
                         .value);
      }
      (this_00->
      super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
      ).
      super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
      .
      super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
      .tree_.root_.
      super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
      .
      super_Storage<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_2UL,_false>
           = (Storage<absl::container_internal::CompressedTuple<std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_*>,_2UL,_false>
              )0x0;
      (this->source_id_map_).
      super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
      .
      super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
      .
      super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
      .tree_.rightmost_ = (node_type *)0x0;
      (this->source_id_map_).
      super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
      .
      super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
      .
      super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>_>
      .tree_.size_ = 0;
      return;
    }
    iVar16 = gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
             ::find_unique<S2BooleanOperation::SourceId>
                       ((btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                         *)this_00,&(ppVar14->second).first);
    iVar17 = gtl::internal_btree::
             btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
             ::end((btree<gtl::internal_btree::map_params<S2BooleanOperation::SourceId,_int,_std::less<S2BooleanOperation::SourceId>,_std::allocator<std::pair<const_S2BooleanOperation::SourceId,_int>_>,_256,_false>_>
                    *)this_00);
    if (iVar16.position == iVar17.position && iVar16.node == iVar17.node) break;
    if (((undefined1  [16])iVar16 & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
      __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                    ,0x1e1,
                    "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2BooleanOperation::SourceId, int>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2BooleanOperation::SourceId, int, std::less<S2BooleanOperation::SourceId>, std::allocator<std::pair<const S2BooleanOperation::SourceId, int>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
                   );
    }
    pIVar2 = this->input_crossings_;
    pVar12.second =
         (CrossingInputEdge)
         ((uint)(ppVar14->second).second +
         *(int *)(iVar16.node + (long)iVar16.position * 0xc + 0x14) * 2);
    pVar12.first = ppVar14->first;
    ppVar3 = (pIVar2->
             super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar3 == (pIVar2->
                  super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ppVar4 = (pIVar2->
               super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = (long)ppVar3 - (long)ppVar4;
      if (lVar13 == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar8 = lVar13 >> 3;
      uVar10 = uVar8;
      if (ppVar3 == ppVar4) {
        uVar10 = 1;
      }
      p_Var15 = (_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                 *)(uVar10 + uVar8);
      if ((_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
           *)0xffffffffffffffe < p_Var15) {
        p_Var15 = (_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                   *)0xfffffffffffffff;
      }
      if (CARRY8(uVar10,uVar8)) {
        p_Var15 = (_Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                   *)0xfffffffffffffff;
      }
      ppVar7 = std::
               _Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
               ::_M_allocate(p_Var15,(size_t)ppVar4);
      *(pair<int,_(anonymous_namespace)::CrossingInputEdge> *)((long)ppVar7 + lVar13) = pVar12;
      ppVar9 = ppVar7;
      for (ppVar11 = ppVar4; ppVar3 != ppVar11; ppVar11 = ppVar11 + 1) {
        *ppVar9 = *ppVar11;
        ppVar9 = ppVar9 + 1;
      }
      if (ppVar4 != (pair<int,_(anonymous_namespace)::CrossingInputEdge> *)0x0) {
        operator_delete(ppVar4);
      }
      (pIVar2->
      super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
      )._M_impl.super__Vector_impl_data._M_start = ppVar7;
      (pIVar2->
      super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppVar9 + 1;
      (pIVar2->
      super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar7 + (long)p_Var15;
    }
    else {
      *ppVar3 = pVar12;
      pppVar1 = &(pIVar2->
                 super__Vector_base<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>,_std::allocator<std::pair<int,_(anonymous_namespace)::CrossingInputEdge>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    ppVar14 = ppVar14 + 1;
  }
  S2LogMessage::S2LogMessage
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
             ,0x6ad,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_40.stream_,"Check failed: it != source_id_map_.end() ",0x29);
  abort();
}

Assistant:

void S2BooleanOperation::Impl::CrossingProcessor::DoneBoundaryPair() {
  // Add entries that translate the "special" crossings.
  source_id_map_[SourceId(kSetInside)] = kSetInside;
  source_id_map_[SourceId(kSetInvertB)] = kSetInvertB;
  source_id_map_[SourceId(kSetReverseA)] = kSetReverseA;
  input_crossings_->reserve(input_crossings_->size() +
                            source_edge_crossings_.size());
  for (const auto& tmp : source_edge_crossings_) {
    auto it = source_id_map_.find(tmp.second.first);
    S2_DCHECK(it != source_id_map_.end());
    input_crossings_->push_back(make_pair(
        tmp.first, CrossingInputEdge(it->second, tmp.second.second)));
  }
  source_edge_crossings_.clear();
  source_id_map_.clear();
}